

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

void __thiscall deqp::gls::ContextArrayPack::~ContextArrayPack(ContextArrayPack *this)

{
  pointer ppCVar1;
  
  this->_vptr_ContextArrayPack = (_func_int **)&PTR__ContextArrayPack_00c421d0;
  for (ppCVar1 = (this->m_arrays).
                 super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar1 !=
      (this->m_arrays).
      super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppCVar1 = ppCVar1 + 1) {
    if (*ppCVar1 != (ContextArray *)0x0) {
      (*((*ppCVar1)->super_Array)._vptr_Array[1])();
    }
  }
  if (this->m_program != (ShaderProgram *)0x0) {
    (*(this->m_program->super_VertexShader)._vptr_VertexShader[2])();
  }
  tcu::Surface::~Surface(&this->m_screen);
  std::_Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>::
  ~_Vector_base(&(this->m_arrays).
                 super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
               );
  return;
}

Assistant:

ContextArrayPack::~ContextArrayPack (void)
{
	for (std::vector<ContextArray*>::iterator itr = m_arrays.begin(); itr != m_arrays.end(); itr++)
		delete *itr;

	delete m_program;
}